

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

bool __thiscall testing::internal::FilePath::DirectoryExists(FilePath *this)

{
  int iVar1;
  StatStruct file_stat;
  FilePath *path;
  bool result;
  StatStruct *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  bool bVar2;
  StatStruct local_a8;
  undefined1 local_9;
  
  local_9 = 0;
  memset(&local_a8,0,0x90);
  c_str((FilePath *)0x13c895);
  iVar1 = posix::Stat((char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                      in_stack_ffffffffffffff48);
  bVar2 = false;
  if (iVar1 == 0) {
    bVar2 = posix::IsDir(&local_a8);
  }
  return bVar2;
}

Assistant:

bool FilePath::DirectoryExists() const {
  bool result = false;
#ifdef GTEST_OS_WINDOWS
  // Don't strip off trailing separator if path is a root directory on
  // Windows (like "C:\\").
  const FilePath& path(IsRootDirectory() ? *this
                                         : RemoveTrailingPathSeparator());
#else
  const FilePath& path(*this);
#endif

#ifdef GTEST_OS_WINDOWS_MOBILE
  LPCWSTR unicode = String::AnsiToUtf16(path.c_str());
  const DWORD attributes = GetFileAttributes(unicode);
  delete[] unicode;
  if ((attributes != kInvalidFileAttributes) &&
      (attributes & FILE_ATTRIBUTE_DIRECTORY)) {
    result = true;
  }
#else
  posix::StatStruct file_stat{};
  result =
      posix::Stat(path.c_str(), &file_stat) == 0 && posix::IsDir(file_stat);
#endif  // GTEST_OS_WINDOWS_MOBILE

  return result;
}